

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void charactersSplit(void *ctx,xmlChar *ch,int len)

{
  code *pcVar1;
  
  if (ctx != (void *)0x0) {
    if ((*(long *)((long)ctx + 0x10) != 0) &&
       (pcVar1 = *(code **)(*(long *)((long)ctx + 0x10) + 0x88), pcVar1 != (code *)0x0)) {
      (*pcVar1)(*(undefined8 *)((long)ctx + 0x20),ch,len);
    }
    if (*(void **)((long)ctx + 0x128) != (void *)0x0) {
      xmlSchemaSAXHandleText(*(void **)((long)ctx + 0x128),ch,len);
      return;
    }
  }
  return;
}

Assistant:

static void
charactersSplit(void *ctx, const xmlChar *ch, int len)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if (ctxt == NULL)
        return;
    if ((ctxt->user_sax != NULL) && (ctxt->user_sax->characters != NULL))
	ctxt->user_sax->characters(ctxt->user_data, ch, len);
    if (ctxt->ctxt != NULL)
	xmlSchemaSAXHandleText(ctxt->ctxt, ch, len);
}